

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::GetKeyPressedAmount(int key_index,float repeat_delay,float repeat_rate)

{
  float t1;
  int in_EDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float t;
  ImGuiContext *g;
  int local_4;
  
  if (in_EDI < 0) {
    local_4 = 0;
  }
  else {
    t1 = (GImGui->IO).KeysDownDuration[in_EDI];
    local_4 = CalcTypematicRepeatAmount(t1 - (GImGui->IO).DeltaTime,t1,in_XMM0_Da,in_XMM1_Da);
  }
  return local_4;
}

Assistant:

int ImGui::GetKeyPressedAmount(int key_index, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    if (key_index < 0)
        return 0;
    IM_ASSERT(key_index >= 0 && key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[key_index];
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}